

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O2

void __thiscall HighVariable::HighVariable(HighVariable *this,Varnode *vn)

{
  _Rb_tree_header *p_Var1;
  int4 iVar2;
  Varnode *local_18;
  
  (this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->wholecover).cover._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->wholecover).cover._M_t._M_impl.super__Rb_tree_header;
  (this->wholecover).cover._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->wholecover).cover._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->wholecover).cover._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->wholecover).cover._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->symbol = (Symbol *)0x0;
  this->numMergeClasses = 1;
  this->highflags = 7;
  this->flags = 0;
  this->type = (Datatype *)0x0;
  this->symboloffset = -1;
  local_18 = vn;
  std::vector<Varnode_*,_std::allocator<Varnode_*>_>::push_back(&this->inst,&local_18);
  iVar2 = this->numMergeClasses;
  local_18->high = this;
  local_18->mergegroup = (short)iVar2 + -1;
  return;
}

Assistant:

HighVariable::HighVariable(Varnode *vn)

{
  numMergeClasses = 1;
  highflags = HighVariable::flagsdirty | HighVariable::typedirty | HighVariable::coverdirty;
  flags = 0;
  type = (Datatype *)0;
  symbol = (Symbol *)0;
  symboloffset = -1;
  inst.push_back(vn);
  vn->setHigh( this, numMergeClasses-1 );
}